

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_fromFloat32
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  float fVar2;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_object_tuple_t *psVar3;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  psVar3 = sysbvm_context_allocateByteTuple(context,(context->roots).float64Type,8);
  psVar3->field_1 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)(double)fVar2;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_fromFloat32(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_float64_encode(context, sysbvm_tuple_float32_decode(arguments[0]));
}